

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O3

void google::glog_internal_namespace_::ShutdownGoogleLoggingUtilities(void)

{
  ostream *poVar1;
  LogMessage LStack_68;
  
  if (g_program_invocation_short_name != 0) {
    g_program_invocation_short_name = 0;
    closelog();
    return;
  }
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/utilities.cc"
             ,0x138);
  poVar1 = LogMessage::stream(&LStack_68);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"Check failed: IsGoogleLoggingInitialized() ",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"You called ShutdownGoogleLogging() without calling InitGoogleLogging() first!",
             0x4d);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_68);
}

Assistant:

bool IsGoogleLoggingInitialized() {
  return g_program_invocation_short_name != nullptr;
}